

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetCursorPosYAndSetupDummyPrevLine(float pos_y,float line_height)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  
  ImGui::SetCursorPosY(pos_y);
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  fVar1 = (pIVar2->DC).CursorPos.y;
  (pIVar2->DC).CursorPosPrevLine.y = fVar1 - line_height;
  (pIVar2->DC).PrevLineHeight = line_height - (pIVar3->Style).ItemSpacing.y;
  if (1 < (pIVar2->DC).ColumnsCount) {
    (pIVar2->DC).ColumnsCellMinY = fVar1;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupDummyPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHere() and Columns() can work when seeking cursor. 
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue. Consider moving within SetCursorXXX functions?
    ImGui::SetCursorPosY(pos_y);
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;      // Setting those fields so that SetScrollHere() can properly function after the end of our clipper usage.
    window->DC.PrevLineHeight = (line_height - GImGui->Style.ItemSpacing.y);    // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (window->DC.ColumnsCount > 1)
        window->DC.ColumnsCellMinY = window->DC.CursorPos.y;                    // Setting this so that cell Y position are set properly
}